

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O3

void __thiscall
wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::visitCall(wasm::Call__(void *this,Call *curr)

{
  Function *__args;
  ostream *poVar1;
  char *in_RCX;
  pair<std::_Rb_tree_iterator<wasm::Name>,_bool> pVar2;
  Name name;
  Name name_00;
  
  __args = Module::getFunction(*(Module **)((long)this + 0xd8),
                               (Name)(curr->target).super_IString.str);
  pVar2 = std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_emplace_unique<wasm::Name&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)((long)this + 0xe8),(Name *)__args);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  \"",3);
    name.super_IString.str._M_str = in_RCX;
    name.super_IString.str._M_len = (*(undefined8 **)((long)this + 0xe0))[1];
    poVar1 = wasm::operator<<((wasm *)&std::cout,(ostream *)**(undefined8 **)((long)this + 0xe0),
                              name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" -> \"",6);
    name_00.super_IString.str._M_str = in_RCX;
    name_00.super_IString.str._M_len =
         (size_t)(__args->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar1 = wasm::operator<<((wasm *)poVar1,
                              (ostream *)
                              (__args->super_Importable).super_Named.name.super_IString.str._M_len,
                              name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"; // call\n",0xb);
    return;
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
        auto* target = module->getFunction(curr->target);
        if (!visitedTargets.emplace(target->name).second) {
          return;
        }
        std::cout << "  \"" << currFunction->name << "\" -> \"" << target->name
                  << "\"; // call\n";
      }